

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

string * __thiscall
embree::XMLLoader::load<std::__cxx11::string>(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  long *in_RDX;
  string *in_RDI;
  ParseLocation *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_50 [24];
  Token *in_stack_ffffffffffffffc8;
  
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDX;
    ParseLocation::str_abi_cxx11_(in_stack_00000008);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),0);
  Token::String_abi_cxx11_(in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string XMLLoader::load<std::string>(const Ref<XML>& xml) {
    if (xml->body.size() < 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong string body");
    return xml->body[0].String();
  }